

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

bool __thiscall cmGlobalGenerator::CheckTargetsForMissingSources(cmGlobalGenerator *this)

{
  cmGeneratorTarget *this_00;
  cmake *this_01;
  bool bVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  TargetType TVar5;
  string *psVar6;
  char *val;
  string *config;
  pointer config_00;
  pointer ppcVar7;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  ostringstream e;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  string local_238;
  pointer local_218;
  pointer local_210;
  cmGlobalGenerator *local_208;
  pointer local_200;
  string local_1f8;
  undefined1 local_1d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_210 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_218 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (local_210 == local_218) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    local_208 = this;
    do {
      ppcVar7 = ((*local_210)->GeneratorTargets).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_200 = ((*local_210)->GeneratorTargets).
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      if (ppcVar7 != local_200) {
        do {
          this_00 = *ppcVar7;
          TVar5 = cmGeneratorTarget::GetType(this_00);
          bVar3 = true;
          if (((TVar5 == GLOBAL_TARGET) ||
              (TVar5 = cmGeneratorTarget::GetType(this_00), TVar5 == INTERFACE_LIBRARY)) ||
             (TVar5 = cmGeneratorTarget::GetType(this_00), TVar5 == UTILITY)) {
            bVar1 = false;
          }
          else {
            local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_238,"ghs_integrity_app","");
            val = cmGeneratorTarget::GetProperty(this_00,&local_238);
            bVar3 = cmSystemTools::IsOn(val);
            bVar1 = true;
          }
          if ((bVar1) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2)) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if (bVar3 == false) {
            local_258.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
            local_258.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
            local_258.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cmMakefile::GetConfigurations
                      ((string *)(local_1d8 + 0x10),this_00->Makefile,&local_258,true);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._16_8_ != &local_1b8) {
              operator_delete((void *)local_1d8._16_8_,local_1b8._M_allocated_capacity + 1);
            }
            pbVar2 = local_258.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            config_00 = local_258.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            if (local_258.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_258.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              local_1a8._M_allocated_capacity = (size_type)local_198;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
              cmGeneratorTarget::GetSourceFiles(this_00,&local_278,(string *)&local_1a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_allocated_capacity != local_198) {
                operator_delete((void *)local_1a8._M_allocated_capacity,
                                local_198[0]._M_allocated_capacity + 1);
              }
            }
            else {
              do {
                cmGeneratorTarget::GetSourceFiles(this_00,&local_278,config_00);
                if (local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start ==
                    local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish) break;
                config_00 = config_00 + 1;
              } while (config_00 != pbVar2);
            }
            if (local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8._M_local_buf);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,"No SOURCES given to target: ",0x1c);
              psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
              this_01 = local_208->CMakeInstance;
              std::__cxx11::stringbuf::str();
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1d8);
              cmake::IssueMessage(this_01,FATAL_ERROR,&local_1f8,(cmListFileBacktrace *)local_1d8);
              if ((cmMakefile *)local_1d8._8_8_ != (cmMakefile *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8._M_local_buf);
              std::ios_base::~ios_base(local_138);
              bVar4 = true;
            }
            if (local_278.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_278.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_278.
                                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_278.
                                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_258);
          }
          ppcVar7 = ppcVar7 + 1;
        } while (ppcVar7 != local_200);
      }
      local_210 = local_210 + 1;
    } while (local_210 != local_218);
  }
  return bVar4;
}

Assistant:

std::string cmGlobalGenerator::GetLanguageOutputExtension(
  cmSourceFile const& source) const
{
  const std::string& lang = source.GetLanguage();
  if (!lang.empty()) {
    auto const it = this->LanguageToOutputExtension.find(lang);
    if (it != this->LanguageToOutputExtension.end()) {
      return it->second;
    }
  } else {
    // if no language is found then check to see if it is already an
    // output extension for some language.  In that case it should be ignored
    // and in this map, so it will not be compiled but will just be used.
    std::string const& ext = source.GetExtension();
    if (!ext.empty()) {
      if (this->OutputExtensions.count(ext)) {
        return ext;
      }
    }
  }
  return "";
}